

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

char * base64_encode(char *buffer,uint len)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int in_ESI;
  byte *in_RDI;
  int maxlen;
  int c3;
  int c2;
  int c1;
  int buflen;
  char *buf;
  uint local_30;
  uint local_2c;
  int local_24;
  int local_14;
  byte *local_10;
  char *local_8;
  
  local_24 = 0;
  iVar2 = (uint)(in_ESI << 2) / 3 + 4;
  local_8 = (char *)malloc((long)iVar2);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    memset(local_8,0,(long)iVar2);
    local_14 = in_ESI;
    local_10 = in_RDI;
    while (local_14 != 0) {
      pbVar3 = local_10 + 1;
      bVar1 = *local_10;
      local_8[local_24] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(int)(uint)bVar1 >> 2]
      ;
      if (local_14 == 1) {
        local_2c = 0;
        local_10 = pbVar3;
      }
      else {
        local_10 = local_10 + 2;
        local_2c = (uint)*pbVar3;
      }
      local_8[local_24 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((bVar1 & 3) << 4 | (int)(local_2c & 0xf0) >> 4)];
      if (local_14 == 1) {
        iVar2 = local_24 + 3;
        local_8[local_24 + 2] = '=';
        local_24 = local_24 + 4;
        local_8[iVar2] = '=';
        break;
      }
      if (local_14 == 2) {
        local_30 = 0;
      }
      else {
        local_30 = (uint)*local_10;
        local_10 = local_10 + 1;
      }
      iVar2 = local_24 + 3;
      local_8[local_24 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((local_2c & 0xf) << 2 | (int)(local_30 & 0xc0) >> 6)];
      if (local_14 == 2) {
        local_24 = local_24 + 4;
        local_8[iVar2] = '=';
        break;
      }
      local_14 = local_14 + -3;
      local_24 = local_24 + 4;
      local_8[iVar2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(local_30 & 0x3f)];
    }
    local_8[local_24] = '\0';
  }
  return local_8;
}

Assistant:

static char *
base64_encode(char *buffer, unsigned int len)
{
    char * buf;
    int buflen = 0;
    int c1, c2, c3;
    int maxlen = len*4/3 + 4;
#ifdef OVERKILL
    maxlen = len*2 + 2;
#endif

    buf = malloc(maxlen * sizeof(char));
    if(buf == NULL) {
	return NULL;
    } else {
	memset(buf, 0, maxlen * sizeof(char));
    }

    while (len) {
	
	c1 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[c1>>2];

	if (--len == 0) c2 = 0;
	else c2 = (unsigned char)*buffer++;
	buf[buflen++] = num_to_char[((c1 & 0x3)<< 4) | ((c2 & 0xf0) >> 4)];

	if (len == 0) {
	    buf[buflen++] = '=';
	    buf[buflen++] = '=';
	    break;
	}

	if (--len == 0) c3 = 0;
	else c3 = (unsigned char)*buffer++;

	buf[buflen++] = num_to_char[((c2 & 0xf) << 2) | ((c3 & 0xc0) >>6)];
	if (len == 0) {
	    buf[buflen++] = '=';

	    break;
	}

	--len;
	buf[buflen++] = num_to_char[c3 & 0x3f];

    }

    buf[buflen]=0;

    return buf;
}